

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestSpec::TagPattern::~TagPattern(TagPattern *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__TagPattern_001694e8;
  pcVar1 = (this->m_tag)._M_dataplus._M_p;
  paVar2 = &(this->m_tag).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

TestSpec::TagPattern::~TagPattern() {}